

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

int s2pred::TriageCompareLineCos2Distance<long_double>
              (Vector3<long_double> *x,Vector3<long_double> *a0,Vector3<long_double> *a1,
              longdouble r2,Vector3<long_double> *n,longdouble n1,longdouble n2)

{
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar1;
  longdouble lVar2;
  longdouble in_ST2;
  double __x;
  __type_conflict _Var3;
  uint local_164;
  longdouble error;
  longdouble diff;
  longdouble m2_error;
  longdouble m1_error;
  longdouble m1;
  undefined1 auStack_b8 [8];
  longdouble m2;
  longdouble n2cos2_r_error;
  longdouble n2cos2_r;
  longdouble cos_r;
  longdouble T_ERR;
  longdouble n2_local;
  longdouble n1_local;
  Vector3<long_double> *local_40;
  Vector3<long_double> *n_local;
  longdouble r2_local;
  Vector3<long_double> *a1_local;
  Vector3<long_double> *a0_local;
  Vector3<long_double> *x_local;
  
  _n_local = r2;
  stack0xffffffffffffffa8 = n1;
  stack0xffffffffffffff98 = n2;
  register0x00001100 = (longdouble)5.421011e-20;
  if (r2 < (longdouble)2.0) {
    register0x00001110 = (longdouble)1 + (longdouble)-0.5 * r2;
    register0x00001110 = register0x00001110 * n2 * register0x00001110;
    register0x00001110 = (longdouble)3.7947076e-19 * register0x00001110;
    local_40 = n;
    unique0x100000ae = a1;
    a1_local = a0;
    a0_local = x;
    Vector3<long_double>::CrossProd((Vector3<long_double> *)((long)&m1 + 8),x,n);
    util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm2
              ((longdouble *)((long)&m1 + 8),(BasicVector<Vector3,_long_double,_3UL> *)x);
    _auStack_b8 = in_ST0;
    std::sqrt(__x);
    _Var3 = std::sqrt<int>(3);
    lVar1 = stack0xffffffffffffffa8 * (longdouble)(8.0 / _Var3 + 1.0);
    _Var3 = std::sqrt<int>(3);
    lVar1 = (longdouble)5.421011e-20 * ((longdouble)(_Var3 * 32.0 * 1.1102230246251565e-16) + lVar1)
    ;
    lVar2 = (longdouble)1.6263033e-19 * _auStack_b8;
    util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm2
              ((longdouble *)a0_local,(BasicVector<Vector3,_long_double,_3UL> *)x);
    _auStack_b8 = _auStack_b8 - stack0xffffffffffffff68 * in_ST2;
    lVar1 = stack0xffffffffffffff58 + (longdouble)2.1684043e-19 * stack0xffffffffffffff68 * in_ST2 +
            lVar1 * (in_ST1 + in_ST1 + lVar1) + lVar2;
    if (_auStack_b8 <= lVar1) {
      local_164 = (uint)(_auStack_b8 < -lVar1);
    }
    else {
      local_164 = 0xffffffff;
    }
    x_local._4_4_ = local_164;
  }
  else {
    x_local._4_4_ = 0xffffffff;
  }
  return x_local._4_4_;
}

Assistant:

int TriageCompareLineCos2Distance(const Vector3<T>& x, const Vector3<T>& a0,
                                  const Vector3<T>& a1, T r2,
                                  const Vector3<T>& n, T n1, T n2) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // The minimum distance is to a point on the edge interior.  Since the true
  // distance to the edge is always less than 90 degrees, we can return
  // immediately if the limit is 90 degrees or larger.
  if (r2 >= 2.0) return -1;  // distance < limit

  // Otherwise we compute cos^2(distance to edge).
  T cos_r = 1 - 0.5 * r2;
  T n2cos2_r = n2 * cos_r * cos_r;
  T n2cos2_r_error = 7 * T_ERR * n2cos2_r;

  // The length of M = X.CrossProd(N) is the cosine of the distance.
  T m2 = x.CrossProd(n).Norm2();
  T m1 = sqrt(m2);
  T m1_error = ((1 + 8 / sqrt(3)) * n1 + 32 * sqrt(3) * DBL_ERR) * T_ERR;
  T m2_error = 3 * T_ERR * m2 + (2 * m1 + m1_error) * m1_error;

  // If we are using extended precision, then it is worthwhile to recompute
  // the length of X more accurately.  Otherwise we use the fact that X is
  // guaranteed to be unit length to within a tolerance of 4 * DBL_ERR.
  if (T_ERR < DBL_ERR) {
    n2cos2_r *= x.Norm2();
    n2cos2_r_error += 4 * T_ERR * n2cos2_r;
  } else {
    n2cos2_r_error += 8 * DBL_ERR * n2cos2_r;
  }
  T diff = m2 - n2cos2_r;
  T error = m2_error + n2cos2_r_error;
  return (diff > error) ? -1 : (diff < -error) ? 1 : 0;
}